

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O3

int __thiscall
anon_unknown.dwarf_d7bd2::ImageManager::_clone
          (ImageManager *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  CopyForm1 p_Var2;
  Image local_48;
  
  ImageTypeManager::image(&local_48,*(ImageTypeManager **)__fn,(uint8_t)__fn[0x68]);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)this,&local_48,*(uint32_t *)((long)__child_stack + 8),
             *(uint32_t *)((long)__child_stack + 0xc),*(uint8_t *)((long)__child_stack + 0x10),
             '\x01');
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_001febe8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  p_Var2 = ImageTypeManager::convert
                     (*(ImageTypeManager **)__fn,*(uint8_t *)((long)__child_stack + 0x20),
                      (uint8_t)__fn[0x68]);
  iVar1 = (*p_Var2)((Image *)__child_stack,(Image *)this);
  return iVar1;
}

Assistant:

PenguinV_Image::Image _clone( const PenguinV_Image::Image & in )
        {
            PenguinV_Image::Image temp = _registrator.image( _type ).generate( in.width(), in.height(), in.colorCount() );
            _registrator.convert( in.type(), _type )( in, temp );
            return temp;
        }